

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSFixed32Array
               (int32_t *a,int n,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int n_local;
  int32_t *a_local;
  
  WriteArray<int>(a,n,output);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed32Array(const int32_t* a, int n,
                                        io::CodedOutputStream* output) {
  WriteArray<int32_t>(a, n, output);
}